

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O2

void __thiscall
cmQtAutoGeneratorMocUic::WorkerSwapJob(cmQtAutoGeneratorMocUic *this,JobHandleT *jobHandle)

{
  JobT *pJVar1;
  __uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
  *__u;
  size_t in_RCX;
  void *__buf;
  mutex *__m;
  int in_R8D;
  unique_lock<std::mutex> jobsLock;
  unique_lock<std::mutex> local_30;
  
  pJVar1 = (jobHandle->_M_t).
           super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
           .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl;
  if (pJVar1 == (JobT *)0x0) {
    std::unique_lock<std::mutex>::unique_lock(&local_30,&this->JobsMutex_);
  }
  else {
    (jobHandle->_M_t).
    super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
    .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl = (JobT *)0x0;
    (*pJVar1->_vptr_JobT[1])();
    __m = &this->JobsMutex_;
    std::unique_lock<std::mutex>::unique_lock(&local_30,__m);
    this->JobsRemain_ = this->JobsRemain_ - 1;
    if (this->JobsRemain_ == 0) {
      ::cm::uv_async_ptr::send
                (&(this->super_cmQtAutoGenerator).UVRequest_,(int)__m,__buf,in_RCX,in_R8D);
    }
  }
  while ((this->JobThreadsAbort_ == false &&
         ((this->JobQueue_).
          super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (this->JobQueue_).
          super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur))) {
    std::condition_variable::wait((unique_lock *)&this->JobsConditionRead_);
  }
  if ((this->JobThreadsAbort_ == false) &&
     (__u = (__uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
             *)(this->JobQueue_).
               super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur,
     (__uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
      *)(this->JobQueue_).
        super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != __u)) {
    std::
    __uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
    ::operator=((__uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
                 *)jobHandle,__u);
    std::
    deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
    ::pop_front(&this->JobQueue_);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void cmQtAutoGeneratorMocUic::WorkerSwapJob(JobHandleT& jobHandle)
{
  bool const jobProcessed(jobHandle);
  if (jobProcessed) {
    jobHandle.reset();
  }
  {
    std::unique_lock<std::mutex> jobsLock(JobsMutex_);
    // Reduce the remaining job count and notify the libuv loop
    // when all jobs are done
    if (jobProcessed) {
      --JobsRemain_;
      if (JobsRemain_ == 0) {
        UVRequest().send();
      }
    }
    // Wait for new jobs
    while (!JobThreadsAbort_ && JobQueue_.empty()) {
      JobsConditionRead_.wait(jobsLock);
    }
    // Try to pick up a new job handle
    if (!JobThreadsAbort_ && !JobQueue_.empty()) {
      jobHandle = std::move(JobQueue_.front());
      JobQueue_.pop_front();
    }
  }
}